

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_flush_container2(cram_fd *fd,cram_container *c)

{
  cram_slice *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = cram_write_container(fd,c);
  iVar3 = -1;
  if ((iVar2 == 0) && (iVar2 = cram_write_block(fd,c->comp_hdr_block), iVar2 == 0)) {
    for (lVar5 = 0; lVar5 < c->curr_slice; lVar5 = lVar5 + 1) {
      pcVar1 = c->slices[lVar5];
      iVar3 = cram_write_block(fd,pcVar1->hdr_block);
      if (iVar3 != 0) {
        return -1;
      }
      lVar4 = 0;
      while (lVar4 < pcVar1->hdr->num_blocks) {
        iVar3 = cram_write_block(fd,pcVar1->block[lVar4]);
        lVar4 = lVar4 + 1;
        if (iVar3 != 0) {
          return -1;
        }
      }
    }
    iVar3 = hflush(fd->fp);
    iVar3 = -(uint)(iVar3 != 0);
  }
  return iVar3;
}

Assistant:

static int cram_flush_container2(cram_fd *fd, cram_container *c) {
    int i, j;

    //fprintf(stderr, "Writing container %d, sum %u\n", c->record_counter, sum);

    /* Write the container struct itself */
    if (0 != cram_write_container(fd, c))
	return -1;

    /* And the compression header */
    if (0 != cram_write_block(fd, c->comp_hdr_block))
	return -1;

    /* Followed by the slice blocks */
    for (i = 0; i < c->curr_slice; i++) {
	cram_slice *s = c->slices[i];

	if (0 != cram_write_block(fd, s->hdr_block))
	    return -1;

	for (j = 0; j < s->hdr->num_blocks; j++) {
	    if (0 != cram_write_block(fd, s->block[j]))
		return -1;
	}
    }

    return hflush(fd->fp) == 0 ? 0 : -1;
}